

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlUIntBeRev(Vm *this,Instr *instr)

{
  Instr *instr_local;
  Vm *this_local;
  
  _execReadFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
            (this,instr);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlUIntBeRev(const Instr& instr)
{
    this->_execReadFlInt<std::uint64_t, readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}